

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slufactor.hpp
# Opt level: O0

void __thiscall
soplex::
SLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::SLUFactor(SLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *this)

{
  SPxOut *pSVar1;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar2;
  SLinSolver<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_RDI;
  SPxMemoryException *x;
  nullptr_t in_stack_ffffffffffffff18;
  cpp_dec_float<200U,_int,_void> *in_stack_ffffffffffffff20;
  double in_stack_ffffffffffffff28;
  cpp_dec_float<200U,_int,_void> *in_stack_ffffffffffffff30;
  SPxOut **__new_size;
  shared_ptr<soplex::Tolerances> *in_stack_ffffffffffffff40;
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  *this_00;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_ffffffffffffff48;
  int iVar3;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_ffffffffffffff50;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_01;
  int n;
  Dring **p;
  undefined1 local_80 [40];
  Dring *local_58 [5];
  uint local_30 [2];
  SLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_02;
  
  SLinSolver<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::SLinSolver(in_RDI);
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::CLUFactor(in_stack_ffffffffffffff48);
  iVar3 = (int)((ulong)in_stack_ffffffffffffff48 >> 0x20);
  in_RDI->_vptr_SLinSolver = (_func_int **)&PTR_getName_0089f910;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)in_stack_ffffffffffffff30,(int)((ulong)in_stack_ffffffffffffff28 >> 0x20));
  n = (int)((ulong)(in_RDI + 0x4d) >> 0x20);
  p = local_58;
  std::shared_ptr<soplex::Tolerances>::shared_ptr
            ((shared_ptr<soplex::Tolerances> *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::SSVectorBase(in_stack_ffffffffffffff50,iVar3,in_stack_ffffffffffffff40);
  std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x648711);
  *(undefined1 *)&in_RDI[0x52]._vptr_SLinSolver = 0;
  *(undefined4 *)((long)&in_RDI[0x52]._vptr_SLinSolver + 4) = 1;
  iVar3 = (int)((ulong)&in_RDI[0x52].spxout >> 0x20);
  this_01 = (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *)(local_80 + 0x18);
  std::shared_ptr<soplex::Tolerances>::shared_ptr
            ((shared_ptr<soplex::Tolerances> *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::SSVectorBase(this_01,iVar3,in_stack_ffffffffffffff40);
  std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x64876b);
  __new_size = &in_RDI[0x57].spxout;
  this_00 = (vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             *)(local_80 + 8);
  std::shared_ptr<soplex::Tolerances>::shared_ptr
            ((shared_ptr<soplex::Tolerances> *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::SSVectorBase(this_01,iVar3,(shared_ptr<soplex::Tolerances> *)this_00);
  std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x6487ae);
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
            (in_stack_ffffffffffffff20);
  local_80._0_8_ = (_func_int **)0x3f847ae147ae147b;
  this_02 = (SLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *)local_80;
  local_30[0] = 0;
  local_30[1] = 0;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
            (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
            (in_stack_ffffffffffffff20);
  *(undefined4 *)&in_RDI[0x75]._vptr_SLinSolver = 1;
  in_RDI[0x2a].spxout = (SPxOut *)0x0;
  in_RDI[0x2a]._vptr_SLinSolver = (_func_int **)0x0;
  in_RDI[0x2b].spxout = (SPxOut *)0x0;
  in_RDI[0x2b]._vptr_SLinSolver = (_func_int **)0x0;
  in_RDI[0x37].spxout = (SPxOut *)0x0;
  in_RDI[0x3a]._vptr_SLinSolver = (_func_int **)0x0;
  in_RDI[0x3a].spxout = (SPxOut *)0x0;
  in_RDI[0x3b]._vptr_SLinSolver = (_func_int **)0x0;
  in_RDI[0x3b].spxout = (SPxOut *)0x0;
  in_RDI[0x3d].spxout = (SPxOut *)0x0;
  in_RDI[0x3e].spxout = (SPxOut *)0x0;
  in_RDI[0x40].spxout = (SPxOut *)0x0;
  in_RDI[0x41]._vptr_SLinSolver = (_func_int **)0x0;
  in_RDI[0x41].spxout = (SPxOut *)0x0;
  in_RDI[0x2e]._vptr_SLinSolver = (_func_int **)0x0;
  in_RDI[0x2f].spxout = (SPxOut *)0x0;
  in_RDI[0x30]._vptr_SLinSolver = (_func_int **)0x0;
  in_RDI[0x32].spxout = (SPxOut *)0x0;
  in_RDI[0x33]._vptr_SLinSolver = (_func_int **)0x0;
  in_RDI[0x33].spxout = (SPxOut *)0x0;
  in_RDI[0x34]._vptr_SLinSolver = (_func_int **)0x0;
  *(undefined4 *)&in_RDI[1].spxout = 0;
  *(undefined4 *)((long)&in_RDI[1]._vptr_SLinSolver + 4) = 0;
  pSVar1 = (SPxOut *)TimerFactory::createTimer((TYPE)((ulong)this_00 >> 0x20));
  in_RDI[0x74].spxout = pSVar1;
  pSVar1 = (SPxOut *)TimerFactory::createTimer((TYPE)((ulong)this_00 >> 0x20));
  in_RDI[0x42].spxout = pSVar1;
  spx_alloc<int*>((int **)p,n);
  spx_alloc<int*>((int **)p,n);
  spx_alloc<int*>((int **)p,n);
  spx_alloc<int*>((int **)p,n);
  std::
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  ::resize(this_00,(size_type)__new_size);
  pnVar2 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ::get_ptr((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *)0x648a2e);
  in_RDI[0x42]._vptr_SLinSolver = (_func_int **)pnVar2;
  *(undefined4 *)&in_RDI[0x38]._vptr_SLinSolver = 1;
  *(undefined4 *)((long)&in_RDI[0x38]._vptr_SLinSolver + 4) = 0;
  spx_alloc<soplex::CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::Dring*>
            (p,n);
  std::
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  ::resize(this_00,(size_type)__new_size);
  spx_alloc<int*>((int **)p,n);
  spx_alloc<int*>((int **)p,n);
  spx_alloc<int*>((int **)p,n);
  spx_alloc<int*>((int **)p,n);
  *(undefined4 *)&in_RDI[0x37]._vptr_SLinSolver =
       *(undefined4 *)((long)&in_RDI[1]._vptr_SLinSolver + 4);
  *(undefined4 *)
   ((long)&(in_RDI[0x3a].spxout)->_vptr_SPxOut +
   (long)*(int *)((long)&in_RDI[1]._vptr_SLinSolver + 4) * 4) = 0;
  *(undefined4 *)
   ((long)&(in_RDI[0x3b].spxout)->_vptr_SPxOut +
   (long)*(int *)((long)&in_RDI[1]._vptr_SLinSolver + 4) * 4) = 0;
  *(undefined4 *)
   ((long)in_RDI[0x3b]._vptr_SLinSolver + (long)*(int *)((long)&in_RDI[1]._vptr_SLinSolver + 4) * 4)
       = 0;
  *(undefined4 *)&in_RDI[0x3e]._vptr_SLinSolver = 1;
  *(undefined4 *)((long)&in_RDI[0x3e]._vptr_SLinSolver + 4) = 0;
  spx_alloc<soplex::CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::Dring*>
            (p,n);
  spx_alloc<int*>((int **)p,n);
  spx_alloc<int*>((int **)p,n);
  spx_alloc<int*>((int **)p,n);
  spx_alloc<int*>((int **)p,n);
  *(undefined4 *)&in_RDI[0x3d]._vptr_SLinSolver =
       *(undefined4 *)((long)&in_RDI[1]._vptr_SLinSolver + 4);
  *(undefined4 *)
   ((long)&(in_RDI[0x40].spxout)->_vptr_SPxOut +
   (long)*(int *)((long)&in_RDI[1]._vptr_SLinSolver + 4) * 4) = 0;
  *(undefined4 *)
   ((long)&(in_RDI[0x41].spxout)->_vptr_SPxOut +
   (long)*(int *)((long)&in_RDI[1]._vptr_SLinSolver + 4) * 4) = 0;
  *(undefined4 *)
   ((long)in_RDI[0x41]._vptr_SLinSolver + (long)*(int *)((long)&in_RDI[1]._vptr_SLinSolver + 4) * 4)
       = 0;
  *(undefined4 *)&in_RDI[0x2c]._vptr_SLinSolver = 1;
  std::
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  ::resize(this_00,(size_type)__new_size);
  spx_alloc<int*>((int **)p,n);
  *(undefined4 *)&in_RDI[0x2e].spxout = 1;
  *(undefined4 *)((long)&in_RDI[0x2e].spxout + 4) = 0;
  *(undefined4 *)&in_RDI[0x2f]._vptr_SLinSolver = 0;
  spx_alloc<int*>((int **)p,n);
  spx_alloc<int*>((int **)p,n);
  in_RDI[0x32].spxout = (SPxOut *)0x0;
  in_RDI[0x33]._vptr_SLinSolver = (_func_int **)0x0;
  in_RDI[0x33].spxout = (SPxOut *)0x0;
  in_RDI[0x34]._vptr_SLinSolver = (_func_int **)0x0;
  clear(this_02);
  *(undefined4 *)&in_RDI[0x43]._vptr_SLinSolver = 0;
  *(undefined4 *)((long)&in_RDI[0x43]._vptr_SLinSolver + 4) = 0;
  *(undefined4 *)((long)&in_RDI[0x75]._vptr_SLinSolver + 4) = 0;
  return;
}

Assistant:

SLUFactor<R>::SLUFactor()
   : vec(1)
   , ssvec(1)
   , usetup(false)
   , uptype(FOREST_TOMLIN)
   , eta(1)
   , forest(1)
   , minThreshold(0.01)
   , timerType(Timer::USER_TIME)
{
   this->row.perm    = nullptr;
   this->row.orig    = nullptr;
   this->col.perm    = nullptr;
   this->col.orig    = nullptr;
   this->u.row.elem  = nullptr;
   this->u.row.idx   = nullptr;
   this->u.row.start = nullptr;
   this->u.row.len   = nullptr;
   this->u.row.max   = nullptr;
   this->u.col.elem  = nullptr;
   this->u.col.idx   = nullptr;
   this->u.col.start = nullptr;
   this->u.col.len   = nullptr;
   this->u.col.max   = nullptr;
   this->l.idx       = nullptr;
   this->l.start     = nullptr;
   this->l.row       = nullptr;
   this->l.ridx      = nullptr;
   this->l.rbeg      = nullptr;
   this->l.rorig     = nullptr;
   this->l.rperm     = nullptr;

   this->nzCnt  = 0;
   this->thedim = 0;

   try
   {
      solveTime = TimerFactory::createTimer(timerType);
      this->factorTime = TimerFactory::createTimer(timerType);
      spx_alloc(this->row.perm, this->thedim);
      spx_alloc(this->row.orig, this->thedim);
      spx_alloc(this->col.perm, this->thedim);
      spx_alloc(this->col.orig, this->thedim);

      this->diag.resize(this->thedim);

      this->work = vec.get_ptr();

      this->u.row.size = 1;
      this->u.row.used = 0;
      spx_alloc(this->u.row.elem,  this->thedim);
      this->u.row.val.resize(this->u.row.size);
      spx_alloc(this->u.row.idx,   this->u.row.size);
      spx_alloc(this->u.row.start, this->thedim + 1);
      spx_alloc(this->u.row.len,   this->thedim + 1);
      spx_alloc(this->u.row.max,   this->thedim + 1);

      this->u.row.list.idx      = this->thedim;
      this->u.row.start[this->thedim] = 0;
      this->u.row.max  [this->thedim] = 0;
      this->u.row.len  [this->thedim] = 0;

      this->u.col.size = 1;
      this->u.col.used = 0;
      spx_alloc(this->u.col.elem,  this->thedim);
      spx_alloc(this->u.col.idx,   this->u.col.size);
      spx_alloc(this->u.col.start, this->thedim + 1);
      spx_alloc(this->u.col.len,   this->thedim + 1);
      spx_alloc(this->u.col.max,   this->thedim + 1);

      this->u.col.list.idx      = this->thedim;
      this->u.col.start[this->thedim] = 0;
      this->u.col.max[this->thedim]   = 0;
      this->u.col.len[this->thedim]   = 0;

      this->l.size = 1;

      this->l.val.resize(this->l.size);
      spx_alloc(this->l.idx, this->l.size);

      this->l.startSize   = 1;
      this->l.firstUpdate = 0;
      this->l.firstUnused = 0;

      spx_alloc(this->l.start, this->l.startSize);
      spx_alloc(this->l.row,   this->l.startSize);
   }
   catch(const SPxMemoryException& x)
   {
      freeAll();
      throw x;
   }

   this->l.ridx  = nullptr;
   this->l.rbeg  = nullptr;
   this->l.rorig = nullptr;
   this->l.rperm = nullptr;

   SLUFactor<R>::clear(); // clear() is virtual

   this->factorCount = 0;
   this->hugeValues = 0;
   solveCount  = 0;
   assert(this->row.perm != nullptr);

   assert(this->row.orig != nullptr);
   assert(this->col.perm != nullptr);
   assert(this->col.orig != nullptr);

   assert(this->u.row.elem  != nullptr);
   assert(this->u.row.idx   != nullptr);
   assert(this->u.row.start != nullptr);
   assert(this->u.row.len   != nullptr);
   assert(this->u.row.max   != nullptr);

   assert(this->u.col.elem  != nullptr);
   assert(this->u.col.idx   != nullptr);
   assert(this->u.col.start != nullptr);
   assert(this->u.col.len   != nullptr);
   assert(this->u.col.max   != nullptr);

   assert(this->l.idx   != nullptr);
   assert(this->l.start != nullptr);
   assert(this->l.row   != nullptr);

   assert(SLUFactor<R>::isConsistent());
}